

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_0::Attribute::Attribute(Attribute *this)

{
  Attribute *this_local;
  
  this->enabled = '\0';
  this->size = 1;
  this->stride = 0;
  this->type = 0x1406;
  this->integer = '\0';
  this->divisor = 0;
  this->offset = 0;
  this->normalized = '\0';
  this->bufferNdx = 0;
  return;
}

Assistant:

Attribute::Attribute (void)
	: enabled		(GL_FALSE)
	, size			(1)
	, stride		(0)
	, type			(GL_FLOAT)
	, integer		(GL_FALSE)
	, divisor		(0)
	, offset		(0)
	, normalized	(GL_FALSE)
	, bufferNdx		(0)
{
}